

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageHair
          (SceneGraph *this,int hash,size_t numHairs,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *pVVar4;
  undefined8 uVar5;
  uint uVar6;
  HairSetNode *this_00;
  ulong uVar7;
  long lVar8;
  Vec3fx *pVVar9;
  undefined7 in_register_00000009;
  size_t sVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  Ref<embree::SceneGraph::MaterialNode> local_48;
  undefined4 local_3c;
  Node *local_38;
  
  local_38 = (Node *)this;
  this_00 = (HairSetNode *)operator_new(0x118);
  local_48 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_3c = (undefined4)CONCAT71(in_register_00000009,mblur);
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,&local_48,(BBox1f)0x3f80000000000000,
             (ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(&this_00->hairs,numHairs);
  uVar6 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
  uVar6 = (uVar6 * -0x194da000 | uVar6 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
  uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  if (numHairs != 0) {
    uVar7 = 0;
    sVar10 = numHairs;
    do {
      uVar17 = uVar6 * 0x19660d + 0x3c6ef35f;
      uVar11 = uVar6 * 0x17385ca9 + 0x47502932;
      bVar19 = (uVar17 & 0x3e) == 0;
      uVar6 = uVar17;
      if (bVar19) {
        uVar6 = uVar11;
      }
      uVar13 = (ulong)uVar11;
      if (!bVar19) {
        uVar13 = uVar7 & 0xffffffff;
      }
      *(ulong *)((long)&((this_00->hairs).
                         super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                         ._M_impl.super__Vector_impl_data._M_start)->vertex + uVar7 * 2) = uVar13;
      uVar7 = uVar7 + 4;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = numHairs << 2;
  uVar7 = pvVar3->size_alloced;
  uVar13 = uVar7;
  if ((uVar7 < uVar14) && (uVar13 = uVar14, uVar18 = uVar7, uVar7 != 0)) {
    do {
      uVar13 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
      uVar18 = uVar13;
    } while (uVar13 < uVar14);
  }
  if (uVar14 < pvVar3->size_active) {
    pvVar3->size_active = uVar14;
  }
  if (uVar7 == uVar13) {
    pvVar3->size_active = uVar14;
  }
  else {
    pVVar4 = pvVar3->items;
    pVVar9 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
    pvVar3->items = pVVar9;
    if (pvVar3->size_active != 0) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar7 < pvVar3->size_active);
    }
    alignedFree(pVVar4);
    pvVar3->size_active = uVar14;
    pvVar3->size_alloced = uVar13;
  }
  if (uVar14 != 0) {
    lVar8 = 0;
    uVar7 = uVar14;
    do {
      iVar12 = uVar6 * 0x19660d;
      iVar15 = uVar6 * 0x17385ca9;
      iVar16 = uVar6 * -0x50b6f56b;
      uVar6 = uVar6 * 0x979e791 + 0xaaf95334;
      puVar1 = (undefined8 *)
               ((long)&((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar8);
      *puVar1 = CONCAT44(iVar15 + 0x47502932,iVar12 + 0x3c6ef35f);
      puVar1[1] = CONCAT44(uVar6,iVar16 + -0x2e330917);
      lVar8 = lVar8 + 0x10;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if ((char)local_3c != '\0') {
    pvVar3 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = pvVar3[1].size_alloced;
    uVar13 = uVar7;
    if ((uVar7 < uVar14) && (uVar13 = uVar14, uVar18 = uVar7, uVar7 != 0)) {
      do {
        uVar13 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
        uVar18 = uVar13;
      } while (uVar13 < uVar14);
    }
    if (uVar14 < pvVar3[1].size_active) {
      pvVar3[1].size_active = uVar14;
    }
    if (uVar7 == uVar13) {
      pvVar3[1].size_active = uVar14;
    }
    else {
      pVVar4 = pvVar3[1].items;
      pVVar9 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
      pvVar3[1].items = pVVar9;
      if (pvVar3[1].size_active != 0) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar8);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pvVar3[1].items)->field_0 + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar7 < pvVar3[1].size_active);
      }
      alignedFree(pVVar4);
      pvVar3[1].size_active = uVar14;
      pvVar3[1].size_alloced = uVar13;
    }
    if (uVar14 != 0) {
      lVar8 = 0;
      do {
        iVar12 = uVar6 * 0x19660d;
        iVar15 = uVar6 * 0x17385ca9;
        iVar16 = uVar6 * -0x50b6f56b;
        uVar6 = uVar6 * 0x979e791 + 0xaaf95334;
        puVar1 = (undefined8 *)
                 ((long)&((this_00->positions).
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].items)->field_0 + lVar8);
        *puVar1 = CONCAT44(iVar15 + 0x47502932,iVar12 + 0x3c6ef35f);
        puVar1[1] = CONCAT44(uVar6,iVar16 + -0x2e330917);
        lVar8 = lVar8 + 0x10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_38;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageHair (int hash, size_t numHairs, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),mblur?2:1);

    mesh->hairs.resize(numHairs);
    for (size_t i=0; i<numHairs; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i);
      mesh->hairs[i] = HairSetNode::Hair(v0,0);
    }

    mesh->positions[0].resize(4*numHairs);
    for (size_t i=0; i<4*numHairs; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3ff(x,y,z,r);
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numHairs);
      for (size_t i=0; i<4*numHairs; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3ff(x,y,z,r);
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }